

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.hpp
# Opt level: O0

actions_fun * __thiscall
estl::state_machine<cdplayer>::get_action_function
          (actions_fun *__return_storage_ptr__,state_machine<cdplayer> *this,state_type from_state)

{
  bool bVar1;
  pointer paVar2;
  bool bVar3;
  __normal_iterator<const_estl::state_machine<cdplayer>::action_entry_*,_std::vector<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>_>
  local_48 [2];
  action_entry *local_38;
  action_entry *local_30;
  __normal_iterator<const_estl::state_machine<cdplayer>::action_entry_*,_std::vector<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>_>
  local_28;
  __normal_iterator<const_estl::state_machine<cdplayer>::action_entry_*,_std::vector<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>_>
  it;
  anon_class_1_0_00000001_for__M_comp compare;
  state_type from_state_local;
  state_machine<cdplayer> *this_local;
  
  it._M_current._3_1_ = 0;
  it._M_current._4_4_ = from_state;
  local_30 = (action_entry *)
             std::
             vector<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
             ::begin(&this->actions_);
  local_38 = (action_entry *)
             std::
             vector<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
             ::end(&this->actions_);
  local_28 = std::
             lower_bound<__gnu_cxx::__normal_iterator<estl::state_machine<cdplayer>::action_entry_const*,std::vector<estl::state_machine<cdplayer>::action_entry,std::allocator<estl::state_machine<cdplayer>::action_entry>>>,cdplayer::state_type,estl::state_machine<cdplayer>::get_action_function(cdplayer::state_type)const::_lambda(estl::state_machine<cdplayer>::action_entry_const&,cdplayer::state_type)_1_>
                       (local_30,local_38,(undefined1 *)((long)&it._M_current + 4));
  local_48[0]._M_current =
       (action_entry *)
       std::
       vector<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>
       ::end(&this->actions_);
  bVar1 = __gnu_cxx::operator!=(&local_28,local_48);
  bVar3 = false;
  if (bVar1) {
    paVar2 = __gnu_cxx::
             __normal_iterator<const_estl::state_machine<cdplayer>::action_entry_*,_std::vector<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>_>
             ::operator->(&local_28);
    bVar3 = paVar2->state == it._M_current._4_4_;
  }
  if (bVar3) {
    paVar2 = __gnu_cxx::
             __normal_iterator<const_estl::state_machine<cdplayer>::action_entry_*,_std::vector<estl::state_machine<cdplayer>::action_entry,_std::allocator<estl::state_machine<cdplayer>::action_entry>_>_>
             ::operator->(&local_28);
    std::function<void_(const_cdplayer::inputs_type_&,_cdplayer::outputs_type_&)>::function
              (__return_storage_ptr__,&paVar2->do_actions);
  }
  else {
    std::function<void_(const_cdplayer::inputs_type_&,_cdplayer::outputs_type_&)>::function
              (__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

actions_fun get_action_function(state_type from_state) const
    {
        constexpr auto compare = [](const action_entry& lhs, state_type state) -> bool {
            return lhs.state < state;
        };

        const auto it = std::lower_bound(actions_.begin(), actions_.end(), from_state, compare);
        if (it != actions_.end() && it->state == from_state) {
            return it->do_actions;
        }
        return nullptr;
    }